

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O3

bool EV_TeleportOther(int other_tid,int dest_tid,bool fog)

{
  bool bVar1;
  bool bVar2;
  AActor *thing;
  
  if ((dest_tid == 0 || other_tid == 0) ||
     (thing = AActor::TIDHash[other_tid & 0x7f], thing == (AActor *)0x0)) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    do {
      if (thing->tid == other_tid) {
        bVar1 = EV_Teleport(dest_tid,0,(line_t_conflict *)0x0,0,thing,4 - (uint)fog);
        bVar2 = (bool)(bVar2 | bVar1);
      }
      thing = thing->inext;
    } while (thing != (AActor *)0x0);
  }
  return bVar2;
}

Assistant:

bool EV_TeleportOther (int other_tid, int dest_tid, bool fog)
{
	bool didSomething = false;

	if (other_tid != 0 && dest_tid != 0)
	{
		AActor *victim;
		FActorIterator iterator (other_tid);

		while ( (victim = iterator.Next ()) )
		{
			didSomething |= EV_Teleport (dest_tid, 0, NULL, 0, victim,
				fog ? (TELF_DESTFOG | TELF_SOURCEFOG) : TELF_KEEPORIENTATION);
		}
	}

	return didSomething;
}